

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

Matrix * projection(Matrix *__return_storage_ptr__,float c)

{
  vector<float,_std::allocator<float>_> *this;
  reference pvVar1;
  float c_local;
  Matrix *Projection;
  
  Matrix::identity(__return_storage_ptr__,4);
  this = Matrix::operator[](__return_storage_ptr__,3);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](this,2);
  *pvVar1 = -1.0 / c;
  return __return_storage_ptr__;
}

Assistant:

Matrix projection(const float c){
    Matrix Projection = Matrix::identity(4);
    Projection[3][2] = -1.f/c;
    return Projection;
}